

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Persistence_intervals::Persistence_intervals
          (Persistence_intervals *this,char *filename,uint dimension)

{
  int in_ECX;
  allocator<char> local_51;
  string local_50 [32];
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_30;
  
  (this->intervals).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intervals).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intervals).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (dimension == 0xffffffff) {
    std::__cxx11::string::string<std::allocator<char>>(local_50,filename,&local_51);
    read_persistence_intervals_in_one_dimension_from_file
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &local_30,(Persistence_representations *)local_50,(string *)0xffffffffffffffff,in_ECX
               ,-1.0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_50,filename,&local_51);
    read_persistence_intervals_in_one_dimension_from_file
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &local_30,(Persistence_representations *)local_50,(string *)(ulong)dimension,in_ECX,
               -1.0);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_move_assign(&this->intervals,&local_30);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_30);
  std::__cxx11::string::~string(local_50);
  this->number_of_functions_for_vectorization =
       (long)(this->intervals).
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->intervals).
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  this->number_of_functions_for_projections_to_reals = 1;
  return;
}

Assistant:

Persistence_intervals::Persistence_intervals(const char* filename, unsigned dimension) {
  if (dimension == std::numeric_limits<unsigned>::max()) {
    this->intervals = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    this->intervals = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  this->set_up_numbers_of_functions_for_vectorization_and_projections_to_reals();
}